

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

QObject * __thiscall QFactoryLoader::instanceHelper_locked(QFactoryLoader *this,int index)

{
  QList<QObject_*(*)()> *this_00;
  pointer puVar1;
  __uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter> this_01;
  qsizetype qVar2;
  _func_QObject_ptr *p_Var3;
  bool bVar4;
  Result RVar5;
  QCborError QVar6;
  int iVar7;
  pointer pbVar8;
  QObject *pQVar9;
  pointer pp_Var10;
  QtPluginMetaDataKeys key;
  undefined8 *puVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  long local_120;
  char *local_110;
  QObject *local_108;
  QByteArray local_b8;
  QByteArray local_98;
  QFactoryLoaderIidSearch local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = (ulong)index;
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(this->d).libraries.
                 super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (uVar12 < uVar13) {
    this_01._M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
    super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl =
         puVar1[uVar12]._M_t.super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>._M_t;
    pbVar8 = QList<bool>::data(&(this->d).loadedLibraries);
    pbVar8[uVar12] = true;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      pQVar9 = QLibraryPrivate::pluginInstance
                         ((QLibraryPrivate *)
                          this_01._M_t.
                          super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                          super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl);
      return pQVar9;
    }
  }
  else {
    local_110 = (this->d).iid.d.ptr;
    if (local_110 == (char *)0x0) {
      local_110 = "";
    }
    qVar2 = (this->d).iid.d.size;
    QPluginLoader::staticPlugins();
    puVar11 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = &(this->d).usedStaticInstances;
    local_120 = 0;
    do {
      p_Var3 = (_func_QObject_ptr *)*puVar11;
      local_78.iid.m_data = local_110;
      local_78.matchesIid = false;
      local_78._17_7_ = 0xaaaaaaaaaaaaaa;
      local_78.iid.m_size = qVar2;
      if ((*(byte *)puVar11[2] & 0xfe) == 0) {
        local_98.d.ptr = (char *)((byte *)puVar11[2] + 4);
        local_98.d.size = puVar11[1] + -4;
        local_98.d.d = (Data *)0x0;
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCborStreamReader::QCborStreamReader((QCborStreamReader *)local_58,&local_98);
        if (local_58[0x10] == 0xa0) {
          bVar4 = QCborStreamReader::_enterContainer_helper((QCborStreamReader *)local_58);
          if (!bVar4) goto LAB_002db20f;
          while (local_58[0x10] != 0xff) {
            if (local_58[0x10] < 0x21) {
              uVar12 = -(ulong)(local_58[0x10] == 0x20) ^ local_58._0_8_;
              key = (QtPluginMetaDataKeys)uVar12;
              RVar5 = 0xaaaaaaaa;
              if ((long)(int)key == uVar12) {
                bVar4 = QCborStreamReader::next((QCborStreamReader *)local_58,10000);
                if (!bVar4) {
                  QCborStreamReader::lastError((QCborStreamReader *)local_58);
                  goto LAB_002db1e5;
                }
                RVar5 = anon_unknown.dwarf_9bac16::QFactoryLoaderIidSearch::operator()
                                  (&local_78,key,(QCborStreamReader *)local_58);
                bVar4 = true;
              }
              else {
LAB_002db1e5:
                bVar4 = false;
              }
              if (!bVar4) goto LAB_002db217;
            }
            else {
              if (local_58[0x10] != 0x60) goto LAB_002db217;
              local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
              QCborStreamReader::readAllUtf8String(&local_b8,(QCborStreamReader *)local_58);
              bVar4 = QByteArray::isNull(&local_b8);
              if (bVar4) {
                RVar5 = 0xaaaaaaaa;
                QCborStreamReader::lastError((QCborStreamReader *)local_58);
              }
              else {
                RVar5 = ContinueSearch;
                QCborStreamReader::next((QCborStreamReader *)local_58,10000);
              }
              if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
                }
              }
              if (bVar4) goto LAB_002db217;
            }
            QVar6 = QCborStreamReader::lastError((QCborStreamReader *)local_58);
            if ((RVar5 != ContinueSearch) || (QVar6.c != NoError)) goto LAB_002db217;
          }
          bVar4 = QCborStreamReader::leaveContainer((QCborStreamReader *)local_58);
          if (!bVar4) goto LAB_002db20f;
        }
        else if (local_58[0x10] == 0xff) {
LAB_002db20f:
          QCborStreamReader::lastError((QCborStreamReader *)local_58);
        }
LAB_002db217:
        instanceHelper_locked();
      }
      iVar7 = 3;
      if (local_78.matchesIid != false) {
        if (local_120 == index - (int)uVar13) {
          if ((this->d).usedStaticInstances.d.size <= local_120) {
            QList<QObject_*(*)()>::resize(this_00,local_120 + 1);
          }
          pp_Var10 = QList<QObject_*(*)()>::data(this_00);
          pp_Var10[local_120] = p_Var3;
          local_108 = (*p_Var3)();
          iVar7 = 1;
        }
        else {
          local_120 = local_120 + 1;
          iVar7 = 0;
        }
      }
      if ((iVar7 != 3) && (iVar7 != 0)) goto LAB_002db2b4;
      puVar11 = puVar11 + 3;
    } while (puVar11 != (undefined8 *)0xaaaaaaaaaaaaaa9a);
    local_108 = (QObject *)0x0;
LAB_002db2b4:
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return local_108;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline QObject *QFactoryLoader::instanceHelper_locked(int index) const
{
#if QT_CONFIG(library)
    if (size_t(index) < d->libraries.size()) {
        QLibraryPrivate *library = d->libraries[index].get();
        d->loadedLibraries[index] = true;
        return library->pluginInstance();
    }
    // we know d->libraries.size() <= index <= numeric_limits<decltype(index)>::max() → no overflow
    index -= static_cast<int>(d->libraries.size());
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const QList<QStaticPlugin> staticPlugins = QPluginLoader::staticPlugins();
    qsizetype i = 0;
    for (QStaticPlugin plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        if (!isIidMatch(pluginData, iid))
            continue;

        if (i == index) {
            if (d->usedStaticInstances.size() <= i)
                d->usedStaticInstances.resize(i + 1);
            d->usedStaticInstances[i] = plugin.instance;
            return plugin.instance();
        }
        ++i;
    }

    return nullptr;
}